

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O2

void __thiscall Shell::NewCNF::Occurrences::replaceBy(Occurrences *this,Formula *f)

{
  bool *pbVar1;
  pair<Kernel::Formula_*,_bool> *ppVar2;
  bool bVar3;
  bool bVar4;
  Literal *pLVar5;
  Iterator occit;
  Occurrence occ;
  
  occit._iterator._prev = (List<Shell::NewCNF::Occurrence> *)0x0;
  occit._iterator._cur = (List<Shell::NewCNF::Occurrence> *)0x0;
  occit._current._obj = (Occurrence *)0x0;
  occit._current._refCnt = (RefCounter *)0x0;
  occit._iterator._lst = &this->_occurrences;
  if ((f->_connective == LITERAL) &&
     (pLVar5 = *(Literal **)(f + 1), ((pLVar5->super_Term)._args[0]._content & 0xc) == 8)) {
    f = (Formula *)Kernel::AtomicFormula::operator_new(0x30);
    pLVar5 = Kernel::Literal::complementaryLiteral(pLVar5);
    bVar3 = true;
    Kernel::AtomicFormula::AtomicFormula((AtomicFormula *)f,pLVar5);
  }
  else {
    bVar3 = false;
  }
  while( true ) {
    bVar4 = Iterator::hasNext(&occit);
    if (!bVar4) break;
    Occurrence::Occurrence(&occ,occit._current._obj);
    ppVar2 = ((occ.gc._obj)->_literals)._array;
    ppVar2[occ.position].first = f;
    if (bVar3) {
      pbVar1 = &ppVar2[occ.position].second;
      *pbVar1 = (bool)(*pbVar1 ^ 1);
    }
    Lib::SmartPtr<Shell::NewCNF::GenClause>::~SmartPtr(&occ.gc);
  }
  Lib::SmartPtr<Shell::NewCNF::Occurrence>::~SmartPtr(&occit._current);
  return;
}

Assistant:

void replaceBy(Formula* f) {
      Occurrences::Iterator occit(*this);

      bool negateOccurrenceSign = false;
      if (f->connective() == LITERAL) {
        Literal* l = f->literal();
        if (l->shared() && ((SIGN)l->polarity() != POSITIVE)) {
          f = new AtomicFormula(Literal::complementaryLiteral(l));
          negateOccurrenceSign = true;
        }
      }

      while (occit.hasNext()) {
        Occurrence occ = occit.next();
        GenLit& gl = occ.gc->_literals[occ.position];
        formula(gl) = f;
        if (negateOccurrenceSign) {
          sign(gl) = OPPOSITE(sign(gl));
        }
      }
    }